

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ReLU_x86_avx::forward_inplace_int8(ReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  char *pcVar2;
  long in_RSI;
  long *in_RDI;
  int i_1;
  char *ptr_1;
  int q_1;
  int i;
  char *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  int in_stack_ffffffffffffff04;
  Mat *in_stack_ffffffffffffff08;
  char *local_b0;
  int local_a4;
  int local_a0;
  Mat local_90;
  char *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x34);
  local_30 = *(int *)(in_RSI + 0x38);
  local_34 = local_24 * local_28 * local_2c;
  local_38 = *(int *)(in_RSI + 0x18);
  if (local_38 == 8) {
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      local_38 = 8;
      for (local_3c = 0; local_3c < local_30; local_3c = local_3c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
        pcVar2 = ncnn::Mat::operator_cast_to_signed_char_(&local_90);
        ncnn::Mat::~Mat((Mat *)0x4ef199);
        local_48 = pcVar2;
        for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
          if (*local_48 < '\0') {
            *local_48 = '\0';
          }
          if (local_48[1] < '\0') {
            local_48[1] = '\0';
          }
          if (local_48[2] < '\0') {
            local_48[2] = '\0';
          }
          if (local_48[3] < '\0') {
            local_48[3] = '\0';
          }
          if (local_48[4] < '\0') {
            local_48[4] = '\0';
          }
          if (local_48[5] < '\0') {
            local_48[5] = '\0';
          }
          if (local_48[6] < '\0') {
            local_48[6] = '\0';
          }
          if (local_48[7] < '\0') {
            local_48[7] = '\0';
          }
          local_48 = local_48 + 8;
        }
      }
    }
  }
  else {
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      for (local_a4 = 0; local_a4 < local_30; local_a4 = local_a4 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
        local_b0 = ncnn::Mat::operator_cast_to_signed_char_((Mat *)&stack0xffffffffffffff08);
        ncnn::Mat::~Mat((Mat *)0x4ef3a8);
        for (in_stack_ffffffffffffff04 = 0; in_stack_ffffffffffffff04 < local_34;
            in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1) {
          if (*local_b0 < '\0') {
            *local_b0 = '\0';
          }
          local_b0 = local_b0 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86_avx::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}